

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_round(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
               lyxp_set *set,int options)

{
  ly_ctx *ctx;
  int iVar1;
  lys_node *plVar2;
  char *pcVar3;
  uint local_4c;
  int ret;
  lys_node_leaf *sleaf;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  if ((options & 0x1cU) == 0) {
    iVar1 = lyxp_set_cast(*args,LYXP_SET_NUMBER,cur_node,param_4,options);
    if (iVar1 == 0) {
      if (((((*args)->val).num == -(longdouble)0) &&
          (!NAN(((*args)->val).num) && !NAN(-(longdouble)0))) ||
         ((((*args)->val).num < (longdouble)0 && ((longdouble)-0.5 <= ((*args)->val).num)))) {
        set_fill_number(set,-(longdouble)0);
      }
      else {
        ((*args)->val).num = (longdouble)0.5 + ((*args)->val).num;
        iVar1 = xpath_floor(args,1,cur_node,param_4,*args,options);
        if (iVar1 != 0) {
          return -1;
        }
        set_fill_number(set,((*args)->val).num);
      }
      args_local._4_4_ = 0;
    }
    else {
      args_local._4_4_ = 0xffffffff;
    }
  }
  else {
    if (((*args)->type == LYXP_SET_SNODE_SET) &&
       (plVar2 = warn_get_snode_in_ctx(*args), plVar2 != (lys_node *)0x0)) {
      if ((plVar2->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        ctx = param_4->ctx;
        pcVar3 = strnodetype(plVar2->nodetype);
        ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".","xpath_round",pcVar3
               ,plVar2->name);
        local_4c = 1;
      }
      else {
        iVar1 = warn_is_specific_type((lys_type *)&plVar2[1].ref,LY_TYPE_DEC64);
        if (iVar1 == 0) {
          ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of type \"decimal64\".","xpath_round",
                 plVar2->name);
        }
        local_4c = (uint)(iVar1 == 0);
      }
    }
    else {
      ly_log(param_4->ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s not a node-set as expected.",
             "xpath_round");
      local_4c = 1;
    }
    set_snode_clear_ctx(set);
    args_local._4_4_ = local_4c;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_round(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
            struct lyxp_set *set, int options)
{
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type != LYXP_SET_SNODE_SET) || !(sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s not a node-set as expected.", __func__);
            ret = EXIT_FAILURE;
        } else if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
            ret = EXIT_FAILURE;
        } else if (!warn_is_specific_type(&sleaf->type, LY_TYPE_DEC64)) {
            LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of type \"decimal64\".", __func__, sleaf->name);
            ret = EXIT_FAILURE;
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }

    /* cover only the cases where floor can't be used */
    if ((args[0]->val.num == -0.0f) || ((args[0]->val.num < 0) && (args[0]->val.num >= -0.5))) {
        set_fill_number(set, -0.0f);
    } else {
        args[0]->val.num += 0.5;
        if (xpath_floor(args, 1, cur_node, local_mod, args[0], options)) {
            return -1;
        }
        set_fill_number(set, args[0]->val.num);
    }

    return EXIT_SUCCESS;
}